

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

void __thiscall tcu::LogWriteFailedError::LogWriteFailedError(LogWriteFailedError *this)

{
  allocator<char> local_31;
  string local_30;
  LogWriteFailedError *local_10;
  LogWriteFailedError *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Writing to test log failed",&local_31);
  ResourceError::ResourceError(&this->super_ResourceError,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  *(undefined ***)&(this->super_ResourceError).super_TestException.super_Exception =
       &PTR__LogWriteFailedError_0168c360;
  return;
}

Assistant:

LogWriteFailedError (void) : ResourceError("Writing to test log failed") {}